

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
::ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
                  *this,char code,bool ignore_zero)

{
  double dVar1;
  int iVar2;
  NumericExpr NVar3;
  Reference RVar4;
  undefined7 in_register_00000031;
  char *gmock_a1;
  MockNLHandler *this_00;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_20;
  
  local_20.field_1.values_ = (Value *)&local_38;
  iVar2 = (int)CONCAT71(in_register_00000031,code);
  switch(iVar2) {
  case 0x6c:
  case 0x6e:
  case 0x73:
    dVar1 = ReadConstant(this,code);
    if (dVar1 == 0.0 && ignore_zero) {
      return (NumericExpr)NULL_ID;
    }
    this_00 = &this->handler_->super_MockNLHandler;
    gmock_a1 = "number";
    break;
  case 0x6d:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
switchD_001c385b_caseD_6d:
    local_38 = 0;
    uStack_30 = 0;
    local_20.types_ = 0;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x261282,&local_20);
  case 0x6f:
    iVar2 = ReadOpCode(this);
    NVar3 = ReadNumericExpr(this,iVar2);
    return (NumericExpr)NVar3.id_;
  case 0x76:
    RVar4 = DoReadReference(this);
    return (NumericExpr)RVar4.id_;
  default:
    if (iVar2 != 0x66) goto switchD_001c385b_caseD_6d;
    ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
    iVar2 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
    MockNLHandler::OnUnhandled(&this->handler_->super_MockNLHandler,"call expression");
    if (0 < iVar2) {
      do {
        ReadSymbolicExpr(this);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    this_00 = &this->handler_->super_MockNLHandler;
    gmock_a1 = "call expression";
  }
  MockNLHandler::OnUnhandled(this_00,gmock_a1);
  return (NumericExpr)NULL_ID;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(char code, bool ignore_zero) {
  switch (code) {
  case 'f': {
    // Read a function call.
    int func_index = ReadUInt(header_.num_funcs);
    int num_args = reader_.ReadUInt();
    reader_.ReadTillEndOfLine();
    typename Handler::CallArgHandler args =
        handler_.BeginCall(func_index, num_args);
    for (int i = 0; i < num_args; ++i)
      args.AddArg(ReadSymbolicExpr());
    return handler_.EndCall(args);
  }
  case 'n': case 'l': case 's': {
    // Read a number.
    double value = ReadConstant(code);
    if (ignore_zero && value == 0)
      break;  // Ignore zero constant.
    return handler_.OnNumber(value);
  }
  case 'o':
    return ReadNumericExpr(ReadOpCode());
  case 'v':
    return DoReadReference();
  default:
    reader_.ReportError("expected expression");
  }
  return NumericExpr();
}